

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HopcroftKarpAlgorithm.cpp
# Opt level: O1

int16_t __thiscall BoxNesting::HopcroftKarpAlgorithm::runAlgorithm(HopcroftKarpAlgorithm *this)

{
  bool bVar1;
  int16_t iVar2;
  short vertex;
  value_type_conflict4 local_3c;
  allocator_type local_39;
  vector<short,_std::allocator<short>_> local_38;
  
  std::vector<short,_std::allocator<short>_>::vector
            (&local_38,(long)this->leftVerticesCount + 1,&NILL,(allocator_type *)&local_3c);
  std::vector<short,_std::allocator<short>_>::_M_move_assign(&this->pairsLeft,&local_38);
  if (local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<short,_std::allocator<short>_>::vector
            (&local_38,(long)this->rightVerticesCount + 1,&NILL,(allocator_type *)&local_3c);
  std::vector<short,_std::allocator<short>_>::_M_move_assign(&this->pairsRight,&local_38);
  if (local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_3c = 0;
  std::vector<short,_std::allocator<short>_>::vector
            (&local_38,(long)this->leftVerticesCount + 1,&local_3c,&local_39);
  std::vector<short,_std::allocator<short>_>::_M_move_assign(&this->distances,&local_38);
  if (local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar2 = this->leftVerticesCount;
  while (bVar1 = bfs(this), bVar1) {
    if (0 < this->leftVerticesCount) {
      vertex = 1;
      do {
        if ((this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start[vertex] == 0) {
          bVar1 = dfs(this,vertex);
          iVar2 = iVar2 - (ushort)bVar1;
        }
        vertex = vertex + 1;
      } while (vertex <= this->leftVerticesCount);
    }
  }
  return iVar2;
}

Assistant:

int16_t HopcroftKarpAlgorithm::runAlgorithm() const
{
	this->pairsLeft = std::vector<int16_t>(this->leftVerticesCount + 1, NILL);
	this->pairsRight = std::vector<int16_t>(this->rightVerticesCount + 1, NILL);
	this->distances = std::vector<int16_t>(this->leftVerticesCount + 1, 0);

	// We have the same amount of visible boxes as there
	// are vertices in the left partition
	// for each valid match (i.e. a box can nest inside another box)
	// we remove a visible box
	int16_t visibleBoxes = this->leftVerticesCount;

	while (bfs()) 
	{ 
		// Find a free vertex 
		for (int16_t i = 1; i <= leftVerticesCount; ++i)
		{
			if (pairsLeft[i] == NILL && this->dfs(i))
			{
				--visibleBoxes;
			}
		}
	}

	return visibleBoxes;
}